

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O1

void __thiscall raspicam::_private::Private_Impl::release(Private_Impl *this)

{
  MMAL_PORT_T *port;
  Private_Impl *this_00;
  
  if (this->_isOpened == true) {
    port = this->camera_video_port;
    if ((port != (MMAL_PORT_T *)0x0) && (port->is_enabled != 0)) {
      mmal_port_disable(port);
      this->camera_video_port = (MMAL_PORT_T *)0x0;
    }
    this_00 = (Private_Impl *)(this->State).camera_component;
    if (this_00 != (Private_Impl *)0x0) {
      mmal_component_disable((MMAL_COMPONENT_T *)this_00);
    }
    destroy_camera_component(this_00,&this->State);
    this->_isOpened = false;
    this->_isCapturing = false;
  }
  return;
}

Assistant:

void Private_Impl::release() {
            if ( !_isOpened ) return;

            // Disable camera_video_port
            if ( camera_video_port && camera_video_port->is_enabled ) {
                mmal_port_disable ( camera_video_port );
                camera_video_port = NULL;
            }
            ////
            // Disable all our ports that are not handled by connections
            if ( State.camera_component )
                mmal_component_disable ( State.camera_component );


            destroy_camera_component ( &State );

            _isOpened=false;
            _isCapturing=false;

        }